

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall
QAbstractItemViewPrivate::columnsAboutToBeRemoved
          (QAbstractItemViewPrivate *this,QModelIndex *parent,int start,int end)

{
  QAbstractItemModel *pQVar1;
  const_iterator it_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QAbstractItemView *pQVar6;
  ulong uVar7;
  QWidget **ppQVar8;
  int in_ECX;
  int iVar9;
  int in_EDX;
  undefined8 *in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *editor;
  int columnCount;
  int column;
  int totalToRemove;
  QAbstractItemView *q;
  QModelIndex index_1;
  iterator it;
  QModelIndex next;
  QModelIndex index;
  QModelIndex current;
  QEditorInfo info;
  undefined4 in_stack_fffffffffffffe48;
  State in_stack_fffffffffffffe4c;
  QAbstractItemViewPrivate *in_stack_fffffffffffffe50;
  QModelIndex *in_stack_fffffffffffffe58;
  uint7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  QAbstractItemModel *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe80;
  byte in_stack_fffffffffffffe87;
  QAbstractItemViewPrivate *this_00;
  int local_160;
  const_iterator local_138;
  piter local_128;
  undefined1 local_118 [24];
  undefined1 *local_100;
  undefined1 *local_f8;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_f0;
  piter local_e8;
  piter local_d8;
  undefined1 local_c8 [24];
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 local_98 [24];
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = q_func(in_RDI);
  QAbstractItemView::setState
            ((QAbstractItemView *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex
            ((QAbstractItemView *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
  bVar2 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffe50);
  if ((((bVar2) && (in_RDI->selectionMode == SingleSelection)) &&
      (iVar5 = QModelIndex::column((QModelIndex *)&local_38), in_EDX <= iVar5)) &&
     (iVar5 = QModelIndex::column((QModelIndex *)&local_38), iVar5 <= in_ECX)) {
    iVar9 = in_ECX - in_EDX;
    iVar5 = (**(code **)(*(long *)in_RDI->model + 0x80))(in_RDI->model,in_RSI);
    if (iVar5 < iVar9 + 1) {
      local_50 = *in_RSI;
      local_48 = in_RSI[1];
      local_40 = in_RSI[2];
      while( true ) {
        bVar2 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffe50);
        in_stack_fffffffffffffe87 = 0;
        if (bVar2) {
          bVar2 = isIndexEnabled(in_stack_fffffffffffffe50,
                                 (QModelIndex *)
                                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          in_stack_fffffffffffffe87 = bVar2 ^ 0xff;
        }
        if ((in_stack_fffffffffffffe87 & 1) == 0) break;
        QModelIndex::parent((QModelIndex *)
                            CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
        local_50 = local_68;
        local_48 = local_60;
        local_40 = local_58;
      }
      bVar2 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffe50);
      if (bVar2) {
        QAbstractItemView::setCurrentIndex
                  ((QAbstractItemView *)
                   CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                   in_stack_fffffffffffffe58);
      }
    }
    else {
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      iVar5 = in_ECX;
      QModelIndex::QModelIndex((QModelIndex *)0x80e692);
      pQVar1 = in_RDI->model;
      QModelIndex::parent((QModelIndex *)
                          CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
      iVar9 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,local_98);
      local_160 = in_ECX;
      do {
        if (iVar9 <= local_160) break;
        in_stack_fffffffffffffe68 = in_RDI->model;
        iVar3 = QModelIndex::row((QModelIndex *)&local_38);
        iVar4 = local_160 + 1;
        QModelIndex::parent((QModelIndex *)
                            CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
        (**(code **)(*(long *)in_stack_fffffffffffffe68 + 0x60))
                  (&local_b0,in_stack_fffffffffffffe68,iVar3,local_160,local_c8);
        local_80 = local_b0;
        local_78 = local_a8;
        local_70 = local_a0;
        uVar7 = (**(code **)(*(long *)&(pQVar6->super_QAbstractScrollArea).super_QFrame.
                                       super_QWidget + 0x2c0))(pQVar6,&local_80);
        local_160 = iVar4;
      } while (((uVar7 & 1) != 0) ||
              (bVar2 = isIndexEnabled(in_stack_fffffffffffffe50,
                                      (QModelIndex *)
                                      CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
              , !bVar2));
      QAbstractItemView::setCurrentIndex
                ((QAbstractItemView *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                 in_stack_fffffffffffffe58);
      in_ECX = iVar5;
    }
  }
  local_d8.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d = (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8 = (piter)QHash<QWidget_*,_QPersistentModelIndex>::begin
                              ((QHash<QWidget_*,_QPersistentModelIndex> *)in_stack_fffffffffffffe68)
  ;
  while( true ) {
    local_e8 = (piter)QHash<QWidget_*,_QPersistentModelIndex>::end
                                ((QHash<QWidget_*,_QPersistentModelIndex> *)
                                 in_stack_fffffffffffffe58);
    bVar2 = QHash<QWidget_*,_QPersistentModelIndex>::iterator::operator!=
                      ((iterator *)in_stack_fffffffffffffe58,(iterator *)in_stack_fffffffffffffe50);
    if (!bVar2) break;
    local_100 = &DAT_aaaaaaaaaaaaaaaa;
    local_f8 = &DAT_aaaaaaaaaaaaaaaa;
    local_f0.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    QHash<QWidget_*,_QPersistentModelIndex>::iterator::value((iterator *)0x80e87e);
    QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)&local_100);
    iVar5 = QModelIndex::column((QModelIndex *)&local_100);
    bVar2 = false;
    if (iVar5 <= in_EDX) {
      iVar5 = QModelIndex::column((QModelIndex *)&local_100);
      bVar2 = false;
      if (in_ECX <= iVar5) {
        (**(code **)(*(long *)in_RDI->model + 0x68))(local_118,in_RDI->model,&local_100);
        bVar2 = ::operator==((QModelIndex *)in_stack_fffffffffffffe50,
                             (QModelIndex *)
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      }
    }
    if (bVar2 == false) {
      QHash<QWidget_*,_QPersistentModelIndex>::iterator::operator++
                ((iterator *)(ulong)in_stack_fffffffffffffe60);
    }
    else {
      ppQVar8 = QHash<QWidget_*,_QPersistentModelIndex>::iterator::key((iterator *)0x80e916);
      this_00 = (QAbstractItemViewPrivate *)*ppQVar8;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      in_stack_fffffffffffffe50 = (QAbstractItemViewPrivate *)&in_RDI->indexEditorHash;
      QHash<QWidget_*,_QPersistentModelIndex>::iterator::value((iterator *)0x80e96b);
      QHash<QPersistentModelIndex,_QEditorInfo>::take
                ((QHash<QPersistentModelIndex,_QEditorInfo> *)in_stack_fffffffffffffe58,
                 (QPersistentModelIndex *)in_stack_fffffffffffffe50);
      in_stack_fffffffffffffe58 = (QModelIndex *)&in_RDI->editorIndexHash;
      QHash<QWidget_*,_QPersistentModelIndex>::const_iterator::const_iterator
                (&local_138,(iterator *)&local_d8);
      it_00.i.d._4_4_ = in_EDX;
      it_00.i.d._0_4_ = in_ECX;
      it_00.i.bucket = (size_t)in_RSI;
      local_128 = (piter)QHash<QWidget_*,_QPersistentModelIndex>::erase
                                   ((QHash<QWidget_*,_QPersistentModelIndex> *)
                                    in_stack_fffffffffffffe68,it_00);
      local_d8 = local_128;
      bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x80e9fc);
      if (bVar2) {
        releaseEditor(this_00,(QWidget *)in_RDI,
                      (QModelIndex *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
      }
      QEditorInfo::~QEditorInfo((QEditorInfo *)0x80ea26);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemViewPrivate::columnsAboutToBeRemoved(const QModelIndex &parent, int start, int end)
{
    Q_Q(QAbstractItemView);

    q->setState(QAbstractItemView::CollapsingState);

    // Ensure one selected item in single selection mode.
    QModelIndex current = q->currentIndex();
    if (current.isValid()
        && selectionMode == QAbstractItemView::SingleSelection
        && current.column() >= start
        && current.column() <= end) {
        int totalToRemove = end - start + 1;
        if (model->columnCount(parent) < totalToRemove) { // no more columns
            QModelIndex index = parent;
            while (index.isValid() && !isIndexEnabled(index))
                index = index.parent();
            if (index.isValid())
                q->setCurrentIndex(index);
        } else {
            int column = end;
            QModelIndex next;
            const int columnCount = model->columnCount(current.parent());
            // find the next visible and enabled item
            while (column < columnCount) {
                next = model->index(current.row(), column++, current.parent());
#ifdef QT_DEBUG
                if (!next.isValid()) {
                    qWarning("Model unexpectedly returned an invalid index");
                    break;
                }
#endif
                if (!q->isIndexHidden(next) && isIndexEnabled(next))
                    break;
            }
            q->setCurrentIndex(next);
        }
    }

    // Remove all affected editors; this is more efficient than waiting for updateGeometries() to clean out editors for invalid indexes
    QEditorIndexHash::iterator it = editorIndexHash.begin();
    while (it != editorIndexHash.end()) {
        QModelIndex index = it.value();
        if (index.column() <= start && index.column() >= end && model->parent(index) == parent) {
            QWidget *editor = it.key();
            QEditorInfo info = indexEditorHash.take(it.value());
            it = editorIndexHash.erase(it);
            if (info.widget)
                releaseEditor(editor, index);
        } else {
            ++it;
        }
    }

}